

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O2

void __thiscall
embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
          (CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *this,
          array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *patch)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  Vec3fa *pVVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t i_1;
  ulong uVar9;
  long lVar10;
  Vec3fa *pVVar11;
  float *pfVar12;
  Vec3fa *pVVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  size_t i;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  Vec3fa center_ring [8];
  
  patch->items[0].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].vertex_level = (this->ring).items[0].vertex_level * 0.5;
  patch->items[0].ring.items[0].face_valence = (this->ring).items[0].face_valence;
  patch->items[0].ring.items[0].edge_valence = (this->ring).items[0].edge_valence;
  patch->items[0].ring.items[0].border_index = (this->ring).items[0].border_index;
  fVar22 = (this->ring).items[0].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[0].ring.items[0].vertex_crease_weight = fVar22;
  patch->items[0].ring.items[0].eval_start_index = (this->ring).items[0].eval_start_index;
  patch->items[0].ring.items[0].eval_unique_identifier =
       (this->ring).items[0].eval_unique_identifier;
  pDVar2 = &patch->items[0].ring.items[0].ring;
  fVar22 = 0.0;
  fVar32 = 0.0;
  fVar33 = 0.0;
  fVar34 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[0].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[0].edge_valence;
    uVar15 = (this->ring).items[0].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pVVar6 = (this->ring).items[0].ring.data;
    pVVar11 = pVVar6 + lVar10;
    pVVar13 = pVVar6 + (lVar16 * 2 - uVar9);
    pVVar6 = pVVar6 + (uVar15 - uVar14);
    fVar28 = ((pVVar13->field_0).m128[0] + (pVVar6->field_0).m128[0] +
             (this->ring).items[0].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0]) * 0.25;
    fVar29 = ((pVVar13->field_0).m128[1] + (pVVar6->field_0).m128[1] +
             (this->ring).items[0].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1]) * 0.25;
    fVar30 = ((pVVar13->field_0).m128[2] + (pVVar6->field_0).m128[2] +
             (this->ring).items[0].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2]) * 0.25;
    fVar31 = ((pVVar13->field_0).m128[3] + (pVVar6->field_0).m128[3] +
             (this->ring).items[0].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3]) * 0.25;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[0].ring.items[0].ring.data = pVVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[0].ring.items[0].ring.data;
    }
    pVVar11 = pVVar11 + lVar10;
    (pVVar11->field_0).m128[0] = fVar28;
    (pVVar11->field_0).m128[1] = fVar29;
    (pVVar11->field_0).m128[2] = fVar30;
    (pVVar11->field_0).m128[3] = fVar31;
    fVar22 = fVar22 + fVar28;
    fVar32 = fVar32 + fVar29;
    fVar33 = fVar33 + fVar30;
    fVar34 = fVar34 + fVar31;
  }
  pDVar1 = &patch->items[0].ring.items[0].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar8 = center_ring[0].field_0._8_8_, uVar7 = center_ring[0].field_0._0_8_,
      uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[0].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar28 = (this->ring).items[0].crease_weight.data[lVar16];
    pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[0].ring.items[0].crease_weight.data[lVar10] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    }
    fVar29 = 0.0;
    if (0.0 <= fVar28 + -1.0) {
      fVar29 = fVar28 + -1.0;
    }
    pfVar12[lVar16] = fVar29;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[0].edge_valence - 1);
    }
    pVVar11 = (this->ring).items[0].ring.data + lVar16 * 2;
    fVar29 = (this->ring).items[0].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0];
    fVar30 = (this->ring).items[0].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1];
    fVar31 = (this->ring).items[0].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2];
    fVar35 = (this->ring).items[0].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3];
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    if ((0x20 < uVar9 + 1) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2))
    {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[0].ring.items[0].ring.data = pVVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[0].ring.items[0].ring.data;
    }
    pVVar13 = pVVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar13 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[0].ring.items[0].ring.data = pVVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar13 = patch->items[0].ring.items[0].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pVVar11 = pVVar11 + uVar9;
    pVVar6 = pVVar13 + uVar14;
    fVar23 = (pVVar11->field_0).m128[0] + (pVVar6->field_0).m128[0];
    fVar25 = (pVVar11->field_0).m128[1] + (pVVar6->field_0).m128[1];
    fVar26 = (pVVar11->field_0).m128[2] + (pVVar6->field_0).m128[2];
    fVar27 = (pVVar11->field_0).m128[3] + (pVVar6->field_0).m128[3];
    pVVar11 = (this->ring).items[0].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pVVar11->field_0).m128[0];
    fVar32 = fVar32 + (pVVar11->field_0).m128[1];
    fVar33 = fVar33 + (pVVar11->field_0).m128[2];
    fVar34 = fVar34 + (pVVar11->field_0).m128[3];
    if (0.0 < fVar28) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[0].ring.items[0].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[0].ring.items[0].ring.data;
      }
      uVar21 = uVar21 + 1;
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = fVar29 * 0.5;
      (pVVar13->field_0).m128[1] = fVar30 * 0.5;
      (pVVar13->field_0).m128[2] = fVar31 * 0.5;
      (pVVar13->field_0).m128[3] = fVar35 * 0.5;
      if (fVar28 < 1.0) {
        fVar24 = 1.0 - fVar28;
        fStack_284 = (fVar30 + fVar25) * 0.25 * fVar24 + fVar28 * fVar30 * 0.5;
        local_288 = (fVar29 + fVar23) * 0.25 * fVar24 + fVar28 * fVar29 * 0.5;
        fStack_280 = (fVar31 + fVar26) * 0.25 * fVar24 + fVar28 * fVar31 * 0.5;
        fStack_27c = (fVar35 + fVar27) * 0.25 * fVar24 + fVar28 * fVar35 * 0.5;
        pVVar13 = patch->items[0].ring.items[0].ring.data;
        if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2)
           ) {
          pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[0].ring.items[0].ring.data = pVVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pVVar13 = patch->items[0].ring.items[0].ring.data;
        }
        goto LAB_005e6a83;
      }
    }
    else {
      local_288 = (fVar29 + fVar23) * 0.25;
      fStack_284 = (fVar30 + fVar25) * 0.25;
      fStack_280 = (fVar31 + fVar26) * 0.25;
      fStack_27c = (fVar35 + fVar27) * 0.25;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[0].ring.items[0].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[0].ring.items[0].ring.data;
LAB_005e6a83:
      }
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = local_288;
      (pVVar13->field_0).m128[1] = fStack_284;
      (pVVar13->field_0).m128[2] = fStack_280;
      (pVVar13->field_0).m128[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[0].face_valence;
  }
  fVar29 = 1.0 / (float)uVar9;
  fVar28 = (float)uVar9 + -2.0;
  fVar30 = (fVar22 * fVar29 + fVar28 * (this->ring).items[0].vtx.field_0.m128[0]) * fVar29;
  fVar32 = (fVar32 * fVar29 + fVar28 * (this->ring).items[0].vtx.field_0.m128[1]) * fVar29;
  fVar33 = (fVar33 * fVar29 + fVar28 * (this->ring).items[0].vtx.field_0.m128[2]) * fVar29;
  fVar29 = (fVar34 * fVar29 + fVar28 * (this->ring).items[0].vtx.field_0.m128[3]) * fVar29;
  patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar30;
  patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar32;
  patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar33;
  patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar29;
  fVar22 = (this->ring).items[0].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005e9e10:
      fVar34 = (this->ring).items[0].vtx.field_0.m128[0];
      fVar32 = (this->ring).items[0].vtx.field_0.m128[1];
      fVar33 = (this->ring).items[0].vtx.field_0.m128[2];
      fVar22 = (this->ring).items[0].vtx.field_0.m128[3];
    }
    else {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar22 * (this->ring).items[0].vtx.field_0.m128[0];
      fVar32 = fVar32 * fVar28 + fVar22 * (this->ring).items[0].vtx.field_0.m128[1];
      fVar33 = fVar33 * fVar28 + fVar22 * (this->ring).items[0].vtx.field_0.m128[2];
      fVar22 = fVar29 * fVar28 + fVar22 * (this->ring).items[0].vtx.field_0.m128[3];
    }
LAB_005e9e18:
    patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar34;
    patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar32;
    patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar33;
    patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005e9e10;
    pVVar13 = (this->ring).items[0].ring.data;
    pVVar11 = pVVar13 + center_ring[0].field_0._0_8_ * 2;
    pVVar13 = pVVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar35 = ((this->ring).items[0].vtx.field_0.m128[0] * 6.0 + (pVVar11->field_0).m128[0] +
             (pVVar13->field_0).m128[0]) * 0.125;
    fVar23 = ((this->ring).items[0].vtx.field_0.m128[1] * 6.0 + (pVVar11->field_0).m128[1] +
             (pVVar13->field_0).m128[1]) * 0.125;
    fVar25 = ((this->ring).items[0].vtx.field_0.m128[2] * 6.0 + (pVVar11->field_0).m128[2] +
             (pVVar13->field_0).m128[2]) * 0.125;
    fVar26 = ((this->ring).items[0].vtx.field_0.m128[3] * 6.0 + (pVVar11->field_0).m128[3] +
             (pVVar13->field_0).m128[3]) * 0.125;
    patch->items[0].ring.items[0].vtx.field_0.m128[0] = fVar35;
    patch->items[0].ring.items[0].vtx.field_0.m128[1] = fVar23;
    patch->items[0].ring.items[0].vtx.field_0.m128[2] = fVar25;
    patch->items[0].ring.items[0].vtx.field_0.m128[3] = fVar26;
    pfVar12 = (this->ring).items[0].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar34 = pfVar12[center_ring[0].field_0._8_8_];
    fVar31 = (fVar22 * 3.0 + fVar34) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[0].ring.items[0].crease_weight.data[lVar16] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    }
    pfVar12[uVar7] = fVar28;
    fVar31 = (fVar34 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < uVar8 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[0].ring.items[0].crease_weight.data[lVar16] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    }
    pfVar12[uVar8] = fVar28;
    fVar22 = (fVar22 + fVar34) * 0.5;
    if (fVar22 < 1.0) {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar35 * fVar22;
      fVar32 = fVar32 * fVar28 + fVar23 * fVar22;
      fVar33 = fVar33 * fVar28 + fVar25 * fVar22;
      fVar22 = fVar29 * fVar28 + fVar26 * fVar22;
      goto LAB_005e9e18;
    }
  }
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[1].vertex_level = (this->ring).items[1].vertex_level * 0.5;
  patch->items[1].ring.items[1].face_valence = (this->ring).items[1].face_valence;
  patch->items[1].ring.items[1].edge_valence = (this->ring).items[1].edge_valence;
  patch->items[1].ring.items[1].border_index = (this->ring).items[1].border_index;
  fVar22 = (this->ring).items[1].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[1].ring.items[1].vertex_crease_weight = fVar22;
  patch->items[1].ring.items[1].eval_start_index = (this->ring).items[1].eval_start_index;
  patch->items[1].ring.items[1].eval_unique_identifier =
       (this->ring).items[1].eval_unique_identifier;
  pDVar2 = &patch->items[1].ring.items[1].ring;
  fVar22 = 0.0;
  fVar32 = 0.0;
  fVar33 = 0.0;
  fVar34 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[1].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[1].edge_valence;
    uVar15 = (this->ring).items[1].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pVVar6 = (this->ring).items[1].ring.data;
    pVVar11 = pVVar6 + lVar10;
    pVVar13 = pVVar6 + (lVar16 * 2 - uVar9);
    pVVar6 = pVVar6 + (uVar15 - uVar14);
    fVar28 = ((pVVar13->field_0).m128[0] + (pVVar6->field_0).m128[0] +
             (this->ring).items[1].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0]) * 0.25;
    fVar29 = ((pVVar13->field_0).m128[1] + (pVVar6->field_0).m128[1] +
             (this->ring).items[1].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1]) * 0.25;
    fVar30 = ((pVVar13->field_0).m128[2] + (pVVar6->field_0).m128[2] +
             (this->ring).items[1].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2]) * 0.25;
    fVar31 = ((pVVar13->field_0).m128[3] + (pVVar6->field_0).m128[3] +
             (this->ring).items[1].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3]) * 0.25;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[1].ring.items[1].ring.data = pVVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[1].ring.items[1].ring.data;
    }
    pVVar11 = pVVar11 + lVar10;
    (pVVar11->field_0).m128[0] = fVar28;
    (pVVar11->field_0).m128[1] = fVar29;
    (pVVar11->field_0).m128[2] = fVar30;
    (pVVar11->field_0).m128[3] = fVar31;
    fVar22 = fVar22 + fVar28;
    fVar32 = fVar32 + fVar29;
    fVar33 = fVar33 + fVar30;
    fVar34 = fVar34 + fVar31;
  }
  pDVar1 = &patch->items[1].ring.items[1].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar8 = center_ring[0].field_0._8_8_, uVar7 = center_ring[0].field_0._0_8_,
      uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[1].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar28 = (this->ring).items[1].crease_weight.data[lVar16];
    pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[1].ring.items[1].crease_weight.data[lVar10] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    }
    fVar29 = 0.0;
    if (0.0 <= fVar28 + -1.0) {
      fVar29 = fVar28 + -1.0;
    }
    pfVar12[lVar16] = fVar29;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[1].edge_valence - 1);
    }
    pVVar11 = (this->ring).items[1].ring.data + lVar16 * 2;
    fVar29 = (this->ring).items[1].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0];
    fVar30 = (this->ring).items[1].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1];
    fVar31 = (this->ring).items[1].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2];
    fVar35 = (this->ring).items[1].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3];
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    if ((0x20 < uVar9 + 1) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2))
    {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[1].ring.items[1].ring.data = pVVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[1].ring.items[1].ring.data;
    }
    pVVar13 = pVVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar13 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[1].ring.items[1].ring.data = pVVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar13 = patch->items[1].ring.items[1].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pVVar11 = pVVar11 + uVar9;
    pVVar6 = pVVar13 + uVar14;
    fVar23 = (pVVar11->field_0).m128[0] + (pVVar6->field_0).m128[0];
    fVar25 = (pVVar11->field_0).m128[1] + (pVVar6->field_0).m128[1];
    fVar26 = (pVVar11->field_0).m128[2] + (pVVar6->field_0).m128[2];
    fVar27 = (pVVar11->field_0).m128[3] + (pVVar6->field_0).m128[3];
    pVVar11 = (this->ring).items[1].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pVVar11->field_0).m128[0];
    fVar32 = fVar32 + (pVVar11->field_0).m128[1];
    fVar33 = fVar33 + (pVVar11->field_0).m128[2];
    fVar34 = fVar34 + (pVVar11->field_0).m128[3];
    if (0.0 < fVar28) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[1].ring.items[1].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[1].ring.items[1].ring.data;
      }
      uVar21 = uVar21 + 1;
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = fVar29 * 0.5;
      (pVVar13->field_0).m128[1] = fVar30 * 0.5;
      (pVVar13->field_0).m128[2] = fVar31 * 0.5;
      (pVVar13->field_0).m128[3] = fVar35 * 0.5;
      if (fVar28 < 1.0) {
        fVar24 = 1.0 - fVar28;
        fStack_284 = (fVar30 + fVar25) * 0.25 * fVar24 + fVar28 * fVar30 * 0.5;
        local_288 = (fVar29 + fVar23) * 0.25 * fVar24 + fVar28 * fVar29 * 0.5;
        fStack_280 = (fVar31 + fVar26) * 0.25 * fVar24 + fVar28 * fVar31 * 0.5;
        fStack_27c = (fVar35 + fVar27) * 0.25 * fVar24 + fVar28 * fVar35 * 0.5;
        pVVar13 = patch->items[1].ring.items[1].ring.data;
        if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2)
           ) {
          pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[1].ring.items[1].ring.data = pVVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pVVar13 = patch->items[1].ring.items[1].ring.data;
        }
        goto LAB_005e72a2;
      }
    }
    else {
      local_288 = (fVar29 + fVar23) * 0.25;
      fStack_284 = (fVar30 + fVar25) * 0.25;
      fStack_280 = (fVar31 + fVar26) * 0.25;
      fStack_27c = (fVar35 + fVar27) * 0.25;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[1].ring.items[1].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[1].ring.items[1].ring.data;
LAB_005e72a2:
      }
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = local_288;
      (pVVar13->field_0).m128[1] = fStack_284;
      (pVVar13->field_0).m128[2] = fStack_280;
      (pVVar13->field_0).m128[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[1].face_valence;
  }
  fVar29 = 1.0 / (float)uVar9;
  fVar28 = (float)uVar9 + -2.0;
  fVar30 = (fVar22 * fVar29 + fVar28 * (this->ring).items[1].vtx.field_0.m128[0]) * fVar29;
  fVar32 = (fVar32 * fVar29 + fVar28 * (this->ring).items[1].vtx.field_0.m128[1]) * fVar29;
  fVar33 = (fVar33 * fVar29 + fVar28 * (this->ring).items[1].vtx.field_0.m128[2]) * fVar29;
  fVar29 = (fVar34 * fVar29 + fVar28 * (this->ring).items[1].vtx.field_0.m128[3]) * fVar29;
  patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar30;
  patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar32;
  patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar33;
  patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar29;
  fVar22 = (this->ring).items[1].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005e9e24:
      fVar34 = (this->ring).items[1].vtx.field_0.m128[0];
      fVar32 = (this->ring).items[1].vtx.field_0.m128[1];
      fVar33 = (this->ring).items[1].vtx.field_0.m128[2];
      fVar22 = (this->ring).items[1].vtx.field_0.m128[3];
    }
    else {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar22 * (this->ring).items[1].vtx.field_0.m128[0];
      fVar32 = fVar32 * fVar28 + fVar22 * (this->ring).items[1].vtx.field_0.m128[1];
      fVar33 = fVar33 * fVar28 + fVar22 * (this->ring).items[1].vtx.field_0.m128[2];
      fVar22 = fVar29 * fVar28 + fVar22 * (this->ring).items[1].vtx.field_0.m128[3];
    }
LAB_005e9e2c:
    patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar34;
    patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar32;
    patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar33;
    patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005e9e24;
    pVVar13 = (this->ring).items[1].ring.data;
    pVVar11 = pVVar13 + center_ring[0].field_0._0_8_ * 2;
    pVVar13 = pVVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar35 = ((this->ring).items[1].vtx.field_0.m128[0] * 6.0 + (pVVar11->field_0).m128[0] +
             (pVVar13->field_0).m128[0]) * 0.125;
    fVar23 = ((this->ring).items[1].vtx.field_0.m128[1] * 6.0 + (pVVar11->field_0).m128[1] +
             (pVVar13->field_0).m128[1]) * 0.125;
    fVar25 = ((this->ring).items[1].vtx.field_0.m128[2] * 6.0 + (pVVar11->field_0).m128[2] +
             (pVVar13->field_0).m128[2]) * 0.125;
    fVar26 = ((this->ring).items[1].vtx.field_0.m128[3] * 6.0 + (pVVar11->field_0).m128[3] +
             (pVVar13->field_0).m128[3]) * 0.125;
    patch->items[1].ring.items[1].vtx.field_0.m128[0] = fVar35;
    patch->items[1].ring.items[1].vtx.field_0.m128[1] = fVar23;
    patch->items[1].ring.items[1].vtx.field_0.m128[2] = fVar25;
    patch->items[1].ring.items[1].vtx.field_0.m128[3] = fVar26;
    pfVar12 = (this->ring).items[1].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar34 = pfVar12[center_ring[0].field_0._8_8_];
    fVar31 = (fVar22 * 3.0 + fVar34) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[1].ring.items[1].crease_weight.data[lVar16] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    }
    pfVar12[uVar7] = fVar28;
    fVar31 = (fVar34 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < uVar8 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[1].ring.items[1].crease_weight.data[lVar16] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    }
    pfVar12[uVar8] = fVar28;
    fVar22 = (fVar22 + fVar34) * 0.5;
    if (fVar22 < 1.0) {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar35 * fVar22;
      fVar32 = fVar32 * fVar28 + fVar23 * fVar22;
      fVar33 = fVar33 * fVar28 + fVar25 * fVar22;
      fVar22 = fVar29 * fVar28 + fVar26 * fVar22;
      goto LAB_005e9e2c;
    }
  }
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[2].vertex_level = (this->ring).items[2].vertex_level * 0.5;
  patch->items[2].ring.items[2].face_valence = (this->ring).items[2].face_valence;
  patch->items[2].ring.items[2].edge_valence = (this->ring).items[2].edge_valence;
  patch->items[2].ring.items[2].border_index = (this->ring).items[2].border_index;
  fVar22 = (this->ring).items[2].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[2].ring.items[2].vertex_crease_weight = fVar22;
  patch->items[2].ring.items[2].eval_start_index = (this->ring).items[2].eval_start_index;
  patch->items[2].ring.items[2].eval_unique_identifier =
       (this->ring).items[2].eval_unique_identifier;
  pDVar2 = &patch->items[2].ring.items[2].ring;
  fVar22 = 0.0;
  fVar32 = 0.0;
  fVar33 = 0.0;
  fVar34 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[2].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[2].edge_valence;
    uVar15 = (this->ring).items[2].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pVVar6 = (this->ring).items[2].ring.data;
    pVVar11 = pVVar6 + lVar10;
    pVVar13 = pVVar6 + (lVar16 * 2 - uVar9);
    pVVar6 = pVVar6 + (uVar15 - uVar14);
    fVar28 = ((pVVar13->field_0).m128[0] + (pVVar6->field_0).m128[0] +
             (this->ring).items[2].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0]) * 0.25;
    fVar29 = ((pVVar13->field_0).m128[1] + (pVVar6->field_0).m128[1] +
             (this->ring).items[2].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1]) * 0.25;
    fVar30 = ((pVVar13->field_0).m128[2] + (pVVar6->field_0).m128[2] +
             (this->ring).items[2].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2]) * 0.25;
    fVar31 = ((pVVar13->field_0).m128[3] + (pVVar6->field_0).m128[3] +
             (this->ring).items[2].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3]) * 0.25;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[2].ring.items[2].ring.data = pVVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[2].ring.items[2].ring.data;
    }
    pVVar11 = pVVar11 + lVar10;
    (pVVar11->field_0).m128[0] = fVar28;
    (pVVar11->field_0).m128[1] = fVar29;
    (pVVar11->field_0).m128[2] = fVar30;
    (pVVar11->field_0).m128[3] = fVar31;
    fVar22 = fVar22 + fVar28;
    fVar32 = fVar32 + fVar29;
    fVar33 = fVar33 + fVar30;
    fVar34 = fVar34 + fVar31;
  }
  pDVar1 = &patch->items[2].ring.items[2].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar8 = center_ring[0].field_0._8_8_, uVar7 = center_ring[0].field_0._0_8_,
      uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[2].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar28 = (this->ring).items[2].crease_weight.data[lVar16];
    pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[2].ring.items[2].crease_weight.data[lVar10] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    }
    fVar29 = 0.0;
    if (0.0 <= fVar28 + -1.0) {
      fVar29 = fVar28 + -1.0;
    }
    pfVar12[lVar16] = fVar29;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[2].edge_valence - 1);
    }
    pVVar11 = (this->ring).items[2].ring.data + lVar16 * 2;
    fVar29 = (this->ring).items[2].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0];
    fVar30 = (this->ring).items[2].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1];
    fVar31 = (this->ring).items[2].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2];
    fVar35 = (this->ring).items[2].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3];
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    if ((0x20 < uVar9 + 1) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2))
    {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[2].ring.items[2].ring.data = pVVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[2].ring.items[2].ring.data;
    }
    pVVar13 = pVVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar13 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[2].ring.items[2].ring.data = pVVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar13 = patch->items[2].ring.items[2].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pVVar11 = pVVar11 + uVar9;
    pVVar6 = pVVar13 + uVar14;
    fVar23 = (pVVar11->field_0).m128[0] + (pVVar6->field_0).m128[0];
    fVar25 = (pVVar11->field_0).m128[1] + (pVVar6->field_0).m128[1];
    fVar26 = (pVVar11->field_0).m128[2] + (pVVar6->field_0).m128[2];
    fVar27 = (pVVar11->field_0).m128[3] + (pVVar6->field_0).m128[3];
    pVVar11 = (this->ring).items[2].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pVVar11->field_0).m128[0];
    fVar32 = fVar32 + (pVVar11->field_0).m128[1];
    fVar33 = fVar33 + (pVVar11->field_0).m128[2];
    fVar34 = fVar34 + (pVVar11->field_0).m128[3];
    if (0.0 < fVar28) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[2].ring.items[2].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[2].ring.items[2].ring.data;
      }
      uVar21 = uVar21 + 1;
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = fVar29 * 0.5;
      (pVVar13->field_0).m128[1] = fVar30 * 0.5;
      (pVVar13->field_0).m128[2] = fVar31 * 0.5;
      (pVVar13->field_0).m128[3] = fVar35 * 0.5;
      if (fVar28 < 1.0) {
        fVar24 = 1.0 - fVar28;
        fStack_284 = (fVar30 + fVar25) * 0.25 * fVar24 + fVar28 * fVar30 * 0.5;
        local_288 = (fVar29 + fVar23) * 0.25 * fVar24 + fVar28 * fVar29 * 0.5;
        fStack_280 = (fVar31 + fVar26) * 0.25 * fVar24 + fVar28 * fVar31 * 0.5;
        fStack_27c = (fVar35 + fVar27) * 0.25 * fVar24 + fVar28 * fVar35 * 0.5;
        pVVar13 = patch->items[2].ring.items[2].ring.data;
        if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2)
           ) {
          pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[2].ring.items[2].ring.data = pVVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pVVar13 = patch->items[2].ring.items[2].ring.data;
        }
        goto LAB_005e7ac4;
      }
    }
    else {
      local_288 = (fVar29 + fVar23) * 0.25;
      fStack_284 = (fVar30 + fVar25) * 0.25;
      fStack_280 = (fVar31 + fVar26) * 0.25;
      fStack_27c = (fVar35 + fVar27) * 0.25;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[2].ring.items[2].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[2].ring.items[2].ring.data;
LAB_005e7ac4:
      }
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = local_288;
      (pVVar13->field_0).m128[1] = fStack_284;
      (pVVar13->field_0).m128[2] = fStack_280;
      (pVVar13->field_0).m128[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[2].face_valence;
  }
  fVar29 = 1.0 / (float)uVar9;
  fVar28 = (float)uVar9 + -2.0;
  fVar30 = (fVar22 * fVar29 + fVar28 * (this->ring).items[2].vtx.field_0.m128[0]) * fVar29;
  fVar32 = (fVar32 * fVar29 + fVar28 * (this->ring).items[2].vtx.field_0.m128[1]) * fVar29;
  fVar33 = (fVar33 * fVar29 + fVar28 * (this->ring).items[2].vtx.field_0.m128[2]) * fVar29;
  fVar29 = (fVar34 * fVar29 + fVar28 * (this->ring).items[2].vtx.field_0.m128[3]) * fVar29;
  patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar30;
  patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar32;
  patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar33;
  patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar29;
  fVar22 = (this->ring).items[2].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005e9e38:
      fVar34 = (this->ring).items[2].vtx.field_0.m128[0];
      fVar32 = (this->ring).items[2].vtx.field_0.m128[1];
      fVar33 = (this->ring).items[2].vtx.field_0.m128[2];
      fVar22 = (this->ring).items[2].vtx.field_0.m128[3];
    }
    else {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar22 * (this->ring).items[2].vtx.field_0.m128[0];
      fVar32 = fVar32 * fVar28 + fVar22 * (this->ring).items[2].vtx.field_0.m128[1];
      fVar33 = fVar33 * fVar28 + fVar22 * (this->ring).items[2].vtx.field_0.m128[2];
      fVar22 = fVar29 * fVar28 + fVar22 * (this->ring).items[2].vtx.field_0.m128[3];
    }
LAB_005e9e40:
    patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar34;
    patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar32;
    patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar33;
    patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005e9e38;
    pVVar13 = (this->ring).items[2].ring.data;
    pVVar11 = pVVar13 + center_ring[0].field_0._0_8_ * 2;
    pVVar13 = pVVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar35 = ((this->ring).items[2].vtx.field_0.m128[0] * 6.0 + (pVVar11->field_0).m128[0] +
             (pVVar13->field_0).m128[0]) * 0.125;
    fVar23 = ((this->ring).items[2].vtx.field_0.m128[1] * 6.0 + (pVVar11->field_0).m128[1] +
             (pVVar13->field_0).m128[1]) * 0.125;
    fVar25 = ((this->ring).items[2].vtx.field_0.m128[2] * 6.0 + (pVVar11->field_0).m128[2] +
             (pVVar13->field_0).m128[2]) * 0.125;
    fVar26 = ((this->ring).items[2].vtx.field_0.m128[3] * 6.0 + (pVVar11->field_0).m128[3] +
             (pVVar13->field_0).m128[3]) * 0.125;
    patch->items[2].ring.items[2].vtx.field_0.m128[0] = fVar35;
    patch->items[2].ring.items[2].vtx.field_0.m128[1] = fVar23;
    patch->items[2].ring.items[2].vtx.field_0.m128[2] = fVar25;
    patch->items[2].ring.items[2].vtx.field_0.m128[3] = fVar26;
    pfVar12 = (this->ring).items[2].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar34 = pfVar12[center_ring[0].field_0._8_8_];
    fVar31 = (fVar22 * 3.0 + fVar34) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[2].ring.items[2].crease_weight.data[lVar16] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    }
    pfVar12[uVar7] = fVar28;
    fVar31 = (fVar34 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < uVar8 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[2].ring.items[2].crease_weight.data[lVar16] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    }
    pfVar12[uVar8] = fVar28;
    fVar22 = (fVar22 + fVar34) * 0.5;
    if (fVar22 < 1.0) {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar35 * fVar22;
      fVar32 = fVar32 * fVar28 + fVar23 * fVar22;
      fVar33 = fVar33 * fVar28 + fVar25 * fVar22;
      fVar22 = fVar29 * fVar28 + fVar26 * fVar22;
      goto LAB_005e9e40;
    }
  }
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[3].ring.items[3].vertex_level = (this->ring).items[3].vertex_level * 0.5;
  patch->items[3].ring.items[3].face_valence = (this->ring).items[3].face_valence;
  patch->items[3].ring.items[3].edge_valence = (this->ring).items[3].edge_valence;
  patch->items[3].ring.items[3].border_index = (this->ring).items[3].border_index;
  fVar22 = (this->ring).items[3].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[3].ring.items[3].vertex_crease_weight = fVar22;
  patch->items[3].ring.items[3].eval_start_index = (this->ring).items[3].eval_start_index;
  patch->items[3].ring.items[3].eval_unique_identifier =
       (this->ring).items[3].eval_unique_identifier;
  pDVar2 = &patch->items[3].ring.items[3].ring;
  fVar22 = 0.0;
  fVar32 = 0.0;
  fVar33 = 0.0;
  fVar34 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[3].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[3].edge_valence;
    uVar15 = (this->ring).items[3].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pVVar6 = (this->ring).items[3].ring.data;
    pVVar11 = pVVar6 + lVar10;
    pVVar13 = pVVar6 + (lVar16 * 2 - uVar9);
    pVVar6 = pVVar6 + (uVar15 - uVar14);
    fVar28 = ((pVVar13->field_0).m128[0] + (pVVar6->field_0).m128[0] +
             (this->ring).items[3].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0]) * 0.25;
    fVar29 = ((pVVar13->field_0).m128[1] + (pVVar6->field_0).m128[1] +
             (this->ring).items[3].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1]) * 0.25;
    fVar30 = ((pVVar13->field_0).m128[2] + (pVVar6->field_0).m128[2] +
             (this->ring).items[3].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2]) * 0.25;
    fVar31 = ((pVVar13->field_0).m128[3] + (pVVar6->field_0).m128[3] +
             (this->ring).items[3].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3]) * 0.25;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[3].ring.items[3].ring.data = pVVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[3].ring.items[3].ring.data;
    }
    pVVar11 = pVVar11 + lVar10;
    (pVVar11->field_0).m128[0] = fVar28;
    (pVVar11->field_0).m128[1] = fVar29;
    (pVVar11->field_0).m128[2] = fVar30;
    (pVVar11->field_0).m128[3] = fVar31;
    fVar22 = fVar22 + fVar28;
    fVar32 = fVar32 + fVar29;
    fVar33 = fVar33 + fVar30;
    fVar34 = fVar34 + fVar31;
  }
  pDVar1 = &patch->items[3].ring.items[3].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[3].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar28 = (this->ring).items[3].crease_weight.data[lVar16];
    pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[3].ring.items[3].crease_weight.data[lVar10] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    }
    fVar29 = 0.0;
    if (0.0 <= fVar28 + -1.0) {
      fVar29 = fVar28 + -1.0;
    }
    pfVar12[lVar16] = fVar29;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[3].edge_valence - 1);
    }
    pVVar11 = (this->ring).items[3].ring.data + lVar16 * 2;
    fVar29 = (this->ring).items[3].vtx.field_0.m128[0] + (pVVar11->field_0).m128[0];
    fVar30 = (this->ring).items[3].vtx.field_0.m128[1] + (pVVar11->field_0).m128[1];
    fVar31 = (this->ring).items[3].vtx.field_0.m128[2] + (pVVar11->field_0).m128[2];
    fVar35 = (this->ring).items[3].vtx.field_0.m128[3] + (pVVar11->field_0).m128[3];
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    if ((0x20 < uVar9 + 1) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2))
    {
      pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[3].ring.items[3].ring.data = pVVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar11 = patch->items[3].ring.items[3].ring.data;
    }
    pVVar13 = pVVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar11 == pDVar2)) {
      pVVar13 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      patch->items[3].ring.items[3].ring.data = pVVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pVVar13 = patch->items[3].ring.items[3].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pVVar11 = pVVar11 + uVar9;
    pVVar6 = pVVar13 + uVar14;
    fVar23 = (pVVar11->field_0).m128[0] + (pVVar6->field_0).m128[0];
    fVar25 = (pVVar11->field_0).m128[1] + (pVVar6->field_0).m128[1];
    fVar26 = (pVVar11->field_0).m128[2] + (pVVar6->field_0).m128[2];
    fVar27 = (pVVar11->field_0).m128[3] + (pVVar6->field_0).m128[3];
    pVVar11 = (this->ring).items[3].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pVVar11->field_0).m128[0];
    fVar32 = fVar32 + (pVVar11->field_0).m128[1];
    fVar33 = fVar33 + (pVVar11->field_0).m128[2];
    fVar34 = fVar34 + (pVVar11->field_0).m128[3];
    if (0.0 < fVar28) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[3].ring.items[3].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[3].ring.items[3].ring.data;
      }
      uVar21 = uVar21 + 1;
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = fVar29 * 0.5;
      (pVVar13->field_0).m128[1] = fVar30 * 0.5;
      (pVVar13->field_0).m128[2] = fVar31 * 0.5;
      (pVVar13->field_0).m128[3] = fVar35 * 0.5;
      if (fVar28 < 1.0) {
        fVar24 = 1.0 - fVar28;
        fStack_284 = (fVar30 + fVar25) * 0.25 * fVar24 + fVar28 * fVar30 * 0.5;
        local_288 = (fVar29 + fVar23) * 0.25 * fVar24 + fVar28 * fVar29 * 0.5;
        fStack_280 = (fVar31 + fVar26) * 0.25 * fVar24 + fVar28 * fVar31 * 0.5;
        fStack_27c = (fVar35 + fVar27) * 0.25 * fVar24 + fVar28 * fVar35 * 0.5;
        pVVar13 = patch->items[3].ring.items[3].ring.data;
        if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2)
           ) {
          pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[3].ring.items[3].ring.data = pVVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pVVar13 = patch->items[3].ring.items[3].ring.data;
        }
        goto LAB_005e82e6;
      }
    }
    else {
      local_288 = (fVar29 + fVar23) * 0.25;
      fStack_284 = (fVar30 + fVar25) * 0.25;
      fStack_280 = (fVar31 + fVar26) * 0.25;
      fStack_27c = (fVar35 + fVar27) * 0.25;
      if ((0x20 < uVar14) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar13 == pDVar2))
      {
        pVVar11 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[3].ring.items[3].ring.data = pVVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pVVar13 = patch->items[3].ring.items[3].ring.data;
LAB_005e82e6:
      }
      pVVar13 = pVVar13 + lVar16 * 2;
      (pVVar13->field_0).m128[0] = local_288;
      (pVVar13->field_0).m128[1] = fStack_284;
      (pVVar13->field_0).m128[2] = fStack_280;
      (pVVar13->field_0).m128[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[3].face_valence;
  }
  fVar29 = 1.0 / (float)uVar9;
  fVar28 = (float)uVar9 + -2.0;
  fVar30 = (fVar22 * fVar29 + fVar28 * (this->ring).items[3].vtx.field_0.m128[0]) * fVar29;
  fVar32 = (fVar32 * fVar29 + fVar28 * (this->ring).items[3].vtx.field_0.m128[1]) * fVar29;
  fVar33 = (fVar33 * fVar29 + fVar28 * (this->ring).items[3].vtx.field_0.m128[2]) * fVar29;
  fVar29 = (fVar34 * fVar29 + fVar28 * (this->ring).items[3].vtx.field_0.m128[3]) * fVar29;
  patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar30;
  patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar32;
  patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar33;
  patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar29;
  fVar22 = (this->ring).items[3].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005e9e4c:
      fVar34 = (this->ring).items[3].vtx.field_0.m128[0];
      fVar32 = (this->ring).items[3].vtx.field_0.m128[1];
      fVar33 = (this->ring).items[3].vtx.field_0.m128[2];
      fVar22 = (this->ring).items[3].vtx.field_0.m128[3];
    }
    else {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar22 * (this->ring).items[3].vtx.field_0.m128[0];
      fVar32 = fVar32 * fVar28 + fVar22 * (this->ring).items[3].vtx.field_0.m128[1];
      fVar33 = fVar33 * fVar28 + fVar22 * (this->ring).items[3].vtx.field_0.m128[2];
      fVar22 = fVar29 * fVar28 + fVar22 * (this->ring).items[3].vtx.field_0.m128[3];
    }
LAB_005e9e54:
    patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar34;
    patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar32;
    patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar33;
    patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005e9e4c;
    pVVar13 = (this->ring).items[3].ring.data;
    pVVar11 = pVVar13 + center_ring[0].field_0._0_8_ * 2;
    pVVar13 = pVVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar35 = ((this->ring).items[3].vtx.field_0.m128[0] * 6.0 + (pVVar11->field_0).m128[0] +
             (pVVar13->field_0).m128[0]) * 0.125;
    fVar23 = ((this->ring).items[3].vtx.field_0.m128[1] * 6.0 + (pVVar11->field_0).m128[1] +
             (pVVar13->field_0).m128[1]) * 0.125;
    fVar25 = ((this->ring).items[3].vtx.field_0.m128[2] * 6.0 + (pVVar11->field_0).m128[2] +
             (pVVar13->field_0).m128[2]) * 0.125;
    fVar26 = ((this->ring).items[3].vtx.field_0.m128[3] * 6.0 + (pVVar11->field_0).m128[3] +
             (pVVar13->field_0).m128[3]) * 0.125;
    patch->items[3].ring.items[3].vtx.field_0.m128[0] = fVar35;
    patch->items[3].ring.items[3].vtx.field_0.m128[1] = fVar23;
    patch->items[3].ring.items[3].vtx.field_0.m128[2] = fVar25;
    patch->items[3].ring.items[3].vtx.field_0.m128[3] = fVar26;
    pfVar12 = (this->ring).items[3].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar34 = pfVar12[center_ring[0].field_0._8_8_];
    fVar31 = (fVar22 * 3.0 + fVar34) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[3].ring.items[3].crease_weight.data[lVar16] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    }
    pfVar12[center_ring[0].field_0._0_8_] = fVar28;
    fVar31 = (fVar34 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar28 = 0.0;
    if (0.0 <= fVar31) {
      fVar28 = fVar31;
    }
    pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._8_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[3].ring.items[3].crease_weight.data[lVar16] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    }
    pfVar12[center_ring[0].field_0._8_8_] = fVar28;
    fVar22 = (fVar22 + fVar34) * 0.5;
    if (fVar22 < 1.0) {
      fVar28 = 1.0 - fVar22;
      fVar34 = fVar30 * fVar28 + fVar35 * fVar22;
      fVar32 = fVar32 * fVar28 + fVar23 * fVar22;
      fVar33 = fVar33 * fVar28 + fVar25 * fVar22;
      fVar22 = fVar29 * fVar28 + fVar26 * fVar22;
      goto LAB_005e9e54;
    }
  }
  fVar22 = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].edge_level = fVar22;
  patch->items[0].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[0].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[0].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[1].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[1].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[2].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[2].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[3].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  iVar5 = (this->ring).items[0].border_index;
  uVar18 = (this->ring).items[0].edge_valence;
  uVar20 = (this->ring).items[1].face_valence;
  patch->items[0].ring.items[1].vertex_level = fVar22;
  patch->items[1].ring.items[0].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[0].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[1].border_index = 2;
    patch->items[0].ring.items[1].face_valence = 3;
    patch->items[1].ring.items[0].border_index = 4;
    patch->items[1].ring.items[0].face_valence = 3;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar8;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data +
              (long)patch->items[0].ring.items[0].border_index + 1;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[2] = fVar22;
    *patch->items[1].ring.items[0].crease_weight.data = fVar22;
    fVar22 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar22;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar20 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar20 < uVar18) {
      patch->items[0].ring.items[1].eval_start_index = 2;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_005e8993;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_005e89ca:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar18;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar18;
  }
  else {
    patch->items[0].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[1].border_index = -1;
    patch->items[0].ring.items[1].face_valence = 4;
    patch->items[1].ring.items[0].border_index = -1;
    patch->items[1].ring.items[0].face_valence = 4;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar8;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[4].field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 1);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 2);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[3] = fVar22;
    *patch->items[1].ring.items[0].crease_weight.data = fVar22;
    patch->items[0].ring.items[1].crease_weight.data[2] = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar22;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar20 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[0].ring.items[1].eval_start_index = 3;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_005e89ca;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_005e8993:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar20;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar20;
  }
  iVar5 = (this->ring).items[1].border_index;
  uVar18 = (this->ring).items[1].edge_valence;
  uVar20 = (this->ring).items[2].face_valence;
  fVar22 = patch->items[1].ring.items[1].edge_level;
  patch->items[1].ring.items[2].vertex_level = fVar22;
  patch->items[2].ring.items[1].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[1].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[2].border_index = 2;
    patch->items[1].ring.items[2].face_valence = 3;
    patch->items[2].ring.items[1].border_index = 4;
    patch->items[2].ring.items[1].face_valence = 3;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar8;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data +
              (long)patch->items[1].ring.items[1].border_index + 1;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[2] = fVar22;
    *patch->items[2].ring.items[1].crease_weight.data = fVar22;
    fVar22 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar22;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar20 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar20 < uVar18) {
      patch->items[1].ring.items[2].eval_start_index = 2;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_005e8dc9;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_005e8e00:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar18;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar18;
  }
  else {
    patch->items[1].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[2].border_index = -1;
    patch->items[1].ring.items[2].face_valence = 4;
    patch->items[2].ring.items[1].border_index = -1;
    patch->items[2].ring.items[1].face_valence = 4;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar8;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[4].field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 1);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 2);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[3] = fVar22;
    *patch->items[2].ring.items[1].crease_weight.data = fVar22;
    patch->items[1].ring.items[2].crease_weight.data[2] = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar22;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar20 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[1].ring.items[2].eval_start_index = 3;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_005e8e00;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_005e8dc9:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar20;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar20;
  }
  iVar5 = (this->ring).items[2].border_index;
  uVar18 = (this->ring).items[2].edge_valence;
  uVar20 = (this->ring).items[3].face_valence;
  fVar22 = patch->items[2].ring.items[2].edge_level;
  patch->items[2].ring.items[3].vertex_level = fVar22;
  patch->items[3].ring.items[2].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[2].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[3].border_index = 2;
    patch->items[2].ring.items[3].face_valence = 3;
    patch->items[3].ring.items[2].border_index = 4;
    patch->items[3].ring.items[2].face_valence = 3;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar8;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data +
              (long)patch->items[2].ring.items[2].border_index + 1;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[2] = fVar22;
    *patch->items[3].ring.items[2].crease_weight.data = fVar22;
    fVar22 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar22;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar20 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar20 < uVar18) {
      patch->items[2].ring.items[3].eval_start_index = 2;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_005e91ff;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_005e9236:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar18;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar18;
  }
  else {
    patch->items[2].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[3].border_index = -1;
    patch->items[2].ring.items[3].face_valence = 4;
    patch->items[3].ring.items[2].border_index = -1;
    patch->items[3].ring.items[2].face_valence = 4;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar8;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[4].field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 1);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 2);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[3] = fVar22;
    *patch->items[3].ring.items[2].crease_weight.data = fVar22;
    patch->items[2].ring.items[3].crease_weight.data[2] = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar22;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar20 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[2].ring.items[3].eval_start_index = 3;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_005e9236;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_005e91ff:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar20;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar20;
  }
  iVar5 = (this->ring).items[3].border_index;
  uVar18 = (this->ring).items[3].edge_valence;
  uVar20 = (this->ring).items[0].face_valence;
  fVar22 = patch->items[3].ring.items[3].edge_level;
  patch->items[3].ring.items[0].vertex_level = fVar22;
  patch->items[0].ring.items[3].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[3].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[0].border_index = 2;
    patch->items[3].ring.items[0].face_valence = 3;
    patch->items[0].ring.items[3].border_index = 4;
    patch->items[0].ring.items[3].face_valence = 3;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar8;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data +
              (long)patch->items[3].ring.items[3].border_index + 1;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[2] = fVar22;
    *patch->items[0].ring.items[3].crease_weight.data = fVar22;
    fVar22 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar22;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar20 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[3].ring.items[0].eval_start_index = 1;
      patch->items[0].ring.items[3].eval_start_index = 2;
      goto LAB_005e9623;
    }
    patch->items[3].ring.items[0].eval_start_index = 2;
    patch->items[0].ring.items[3].eval_start_index = 0;
  }
  else {
    patch->items[3].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[0].border_index = -1;
    patch->items[3].ring.items[0].face_valence = 4;
    patch->items[0].ring.items[3].border_index = -1;
    patch->items[0].ring.items[3].face_valence = 4;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar8;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pVVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[1].field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11->field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[4].field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[7].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 1);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[6].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 2);
    uVar7 = *(undefined8 *)&pVVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11->field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[2].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[4].field_0 + 8) = uVar8;
    pVVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pVVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pVVar11[2].field_0 + 8);
    pVVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pVVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[1].field_0 + 8) = uVar8;
    pVVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pVVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pVVar11[3].field_0 + 8) = uVar8;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[3] = fVar22;
    *patch->items[0].ring.items[3].crease_weight.data = fVar22;
    patch->items[3].ring.items[0].crease_weight.data[2] = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar22;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar20 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[3].ring.items[0].eval_start_index = 3;
      patch->items[0].ring.items[3].eval_start_index = 0;
LAB_005e9623:
      patch->items[3].ring.items[0].eval_unique_identifier = uVar18;
      patch->items[0].ring.items[3].eval_unique_identifier = uVar18;
      goto LAB_005e962f;
    }
    patch->items[3].ring.items[0].eval_start_index = 1;
    patch->items[0].ring.items[3].eval_start_index = 2;
  }
  patch->items[3].ring.items[0].eval_unique_identifier = uVar20;
  patch->items[0].ring.items[3].eval_unique_identifier = uVar20;
LAB_005e962f:
  fVar22 = ((this->ring).items[0].vtx.field_0.m128[0] + (this->ring).items[1].vtx.field_0.m128[0] +
            (this->ring).items[2].vtx.field_0.m128[0] + (this->ring).items[3].vtx.field_0.m128[0]) *
           0.25;
  fVar32 = ((this->ring).items[0].vtx.field_0.m128[1] + (this->ring).items[1].vtx.field_0.m128[1] +
            (this->ring).items[2].vtx.field_0.m128[1] + (this->ring).items[3].vtx.field_0.m128[1]) *
           0.25;
  fVar33 = ((this->ring).items[0].vtx.field_0.m128[2] + (this->ring).items[1].vtx.field_0.m128[2] +
            (this->ring).items[2].vtx.field_0.m128[2] + (this->ring).items[3].vtx.field_0.m128[2]) *
           0.25;
  fVar34 = ((this->ring).items[0].vtx.field_0.m128[3] + (this->ring).items[1].vtx.field_0.m128[3] +
            (this->ring).items[2].vtx.field_0.m128[3] + (this->ring).items[3].vtx.field_0.m128[3]) *
           0.25;
  pVVar11 = patch->items[3].ring.items[3].ring.data;
  center_ring[0].field_0._0_8_ = *(undefined8 *)&pVVar11->field_0;
  center_ring[0].field_0._8_8_ = *(undefined8 *)((long)&pVVar11->field_0 + 8);
  center_ring[7].field_0._0_8_ = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
  center_ring[7].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
  pVVar11 = patch->items[2].ring.items[2].ring.data;
  center_ring[6].field_0._0_8_ = *(undefined8 *)&pVVar11->field_0;
  center_ring[6].field_0._8_8_ = *(undefined8 *)((long)&pVVar11->field_0 + 8);
  center_ring[5].field_0._0_8_ = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
  center_ring[5].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
  pVVar11 = patch->items[1].ring.items[1].ring.data;
  center_ring[4].field_0._0_8_ = *(undefined8 *)&pVVar11->field_0;
  center_ring[4].field_0._8_8_ = *(undefined8 *)((long)&pVVar11->field_0 + 8);
  center_ring[3].field_0._0_8_ = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
  center_ring[3].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
  pVVar11 = patch->items[0].ring.items[0].ring.data;
  center_ring[2].field_0._0_8_ = *(undefined8 *)&pVVar11->field_0;
  center_ring[2].field_0._8_8_ = *(undefined8 *)((long)&pVVar11->field_0 + 8);
  center_ring[1].field_0._0_8_ = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
  center_ring[1].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
  patch->items[0].ring.items[2].vertex_level = 0.0;
  patch->items[0].ring.items[2].border_index = -1;
  patch->items[0].ring.items[2].face_valence = 4;
  patch->items[0].ring.items[2].edge_valence = 8;
  patch->items[0].ring.items[2].vertex_crease_weight = 0.0;
  patch->items[0].ring.items[2].vtx.field_0.m128[0] = fVar22;
  patch->items[0].ring.items[2].vtx.field_0.m128[1] = fVar32;
  patch->items[0].ring.items[2].vtx.field_0.m128[2] = fVar33;
  patch->items[0].ring.items[2].vtx.field_0.m128[3] = fVar34;
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    uVar7 = *(undefined8 *)((long)&center_ring[0].field_0 + lVar16 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[2].ring.data)->field_0 + lVar16);
    *puVar3 = *(undefined8 *)((long)&center_ring[0].field_0 + lVar16);
    puVar3[1] = uVar7;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[0].ring.items[2].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[0].ring.items[2].eval_start_index = 4;
  uVar18 = patch->items[0].ring.items[2].face_valence;
  if (uVar18 < 5) {
    patch->items[0].ring.items[2].eval_start_index = 4 - uVar18;
  }
  patch->items[0].ring.items[2].eval_unique_identifier = 0;
  patch->items[1].ring.items[3].vertex_level = 0.0;
  patch->items[1].ring.items[3].border_index = -1;
  patch->items[1].ring.items[3].face_valence = 4;
  patch->items[1].ring.items[3].edge_valence = 8;
  patch->items[1].ring.items[3].vertex_crease_weight = 0.0;
  patch->items[1].ring.items[3].vtx.field_0.m128[0] = fVar22;
  patch->items[1].ring.items[3].vtx.field_0.m128[1] = fVar32;
  patch->items[1].ring.items[3].vtx.field_0.m128[2] = fVar33;
  patch->items[1].ring.items[3].vtx.field_0.m128[3] = fVar34;
  lVar10 = 0;
  for (lVar16 = 2; lVar16 != 10; lVar16 = lVar16 + 1) {
    uVar21 = (ulong)(((uint)lVar16 & 7) << 4);
    uVar7 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[3].ring.data)->field_0 + lVar10);
    *puVar3 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21);
    puVar3[1] = uVar7;
    lVar10 = lVar10 + 0x10;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[1].ring.items[3].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[1].ring.items[3].eval_start_index = 3;
  uVar18 = patch->items[1].ring.items[3].face_valence;
  if (uVar18 < 4) {
    patch->items[1].ring.items[3].eval_start_index = 3 - uVar18;
  }
  patch->items[1].ring.items[3].eval_unique_identifier = 0;
  patch->items[2].ring.items[0].vertex_level = 0.0;
  patch->items[2].ring.items[0].border_index = -1;
  patch->items[2].ring.items[0].face_valence = 4;
  patch->items[2].ring.items[0].edge_valence = 8;
  patch->items[2].ring.items[0].vertex_crease_weight = 0.0;
  patch->items[2].ring.items[0].vtx.field_0.m128[0] = fVar22;
  patch->items[2].ring.items[0].vtx.field_0.m128[1] = fVar32;
  patch->items[2].ring.items[0].vtx.field_0.m128[2] = fVar33;
  patch->items[2].ring.items[0].vtx.field_0.m128[3] = fVar34;
  lVar16 = 0;
  for (uVar21 = 0; uVar21 != 8; uVar21 = uVar21 + 1) {
    uVar7 = *(undefined8 *)((long)&center_ring[uVar21 ^ 4].field_0 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[0].ring.data)->field_0 + lVar16);
    *puVar3 = *(undefined8 *)&center_ring[uVar21 ^ 4].field_0;
    puVar3[1] = uVar7;
    lVar16 = lVar16 + 0x10;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[2].ring.items[0].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[2].ring.items[0].eval_start_index = 2;
  uVar18 = patch->items[2].ring.items[0].face_valence;
  if (uVar18 < 3) {
    patch->items[2].ring.items[0].eval_start_index = 2 - uVar18;
  }
  patch->items[2].ring.items[0].eval_unique_identifier = 0;
  patch->items[3].ring.items[1].vertex_level = 0.0;
  patch->items[3].ring.items[1].border_index = -1;
  patch->items[3].ring.items[1].face_valence = 4;
  patch->items[3].ring.items[1].edge_valence = 8;
  patch->items[3].ring.items[1].vertex_crease_weight = 0.0;
  patch->items[3].ring.items[1].vtx.field_0.m128[0] = fVar22;
  patch->items[3].ring.items[1].vtx.field_0.m128[1] = fVar32;
  patch->items[3].ring.items[1].vtx.field_0.m128[2] = fVar33;
  patch->items[3].ring.items[1].vtx.field_0.m128[3] = fVar34;
  lVar10 = 0;
  for (lVar16 = 6; lVar16 != 0xe; lVar16 = lVar16 + 1) {
    uVar21 = (ulong)(((uint)lVar16 & 7) << 4);
    uVar7 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[1].ring.data)->field_0 + lVar10);
    *puVar3 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21);
    puVar3[1] = uVar7;
    lVar10 = lVar10 + 0x10;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[3].ring.items[1].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[3].ring.items[1].eval_start_index = 1;
  uVar18 = patch->items[3].ring.items[1].face_valence;
  if (uVar18 < 2) {
    patch->items[3].ring.items[1].eval_start_index = 1 - uVar18;
  }
  patch->items[3].ring.items[1].eval_unique_identifier = 0;
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatchT,4>& patch) const
    {
      ring[0].subdivide(patch[0].ring[0]);
      ring[1].subdivide(patch[1].ring[1]);
      ring[2].subdivide(patch[2].ring[2]);
      ring[3].subdivide(patch[3].ring[3]);
      
      patch[0].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[0].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[0].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[0].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      patch[1].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[1].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[1].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[1].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[2].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[2].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[2].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[2].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[3].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[3].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[3].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[3].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      const bool regular0 = ring[0].has_last_face() && ring[1].face_valence > 2;
      if (likely(regular0))
        init_regular(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      else
        init_border(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      
      const bool regular1 = ring[1].has_last_face() && ring[2].face_valence > 2;
      if (likely(regular1))
        init_regular(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      else
        init_border(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      
      const bool regular2 = ring[2].has_last_face() && ring[3].face_valence > 2;
      if (likely(regular2))
        init_regular(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      else
        init_border(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      
      const bool regular3 = ring[3].has_last_face() && ring[0].face_valence > 2;
      if (likely(regular3))
        init_regular(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      else
        init_border(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      
      Vertex_t center = (ring[0].vtx + ring[1].vtx + ring[2].vtx + ring[3].vtx) * 0.25f;

      Vertex_t center_ring[8];
      center_ring[0] = (Vertex_t)patch[3].ring[3].ring[0];
      center_ring[7] = (Vertex_t)patch[3].ring[3].vtx;
      center_ring[6] = (Vertex_t)patch[2].ring[2].ring[0];
      center_ring[5] = (Vertex_t)patch[2].ring[2].vtx;
      center_ring[4] = (Vertex_t)patch[1].ring[1].ring[0];
      center_ring[3] = (Vertex_t)patch[1].ring[1].vtx;
      center_ring[2] = (Vertex_t)patch[0].ring[0].ring[0];
      center_ring[1] = (Vertex_t)patch[0].ring[0].vtx;
      
      init_regular(center,center_ring,0,patch[0].ring[2]);
      init_regular(center,center_ring,2,patch[1].ring[3]);
      init_regular(center,center_ring,4,patch[2].ring[0]);
      init_regular(center,center_ring,6,patch[3].ring[1]);
      
      assert(patch[0].verify());
      assert(patch[1].verify());
      assert(patch[2].verify());
      assert(patch[3].verify());
    }